

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventFilter.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::filterEvents_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Session *session,EventFilter *filter)

{
  size_t __n;
  WriterProp *entry;
  uint64_t uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<binlog::Session::Channel> *psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  int iVar6;
  Channel *__tmp;
  size_t sVar7;
  shared_ptr<binlog::Session::Channel> *psVar8;
  undefined8 uVar9;
  _anonymous_namespace_ *__n_00;
  long lVar10;
  void *pvVar11;
  void *pvVar12;
  void *__buf;
  shared_ptr<binlog::Session::Channel> *channelptr;
  undefined8 *puVar13;
  shared_ptr<binlog::Session::Channel> *psVar14;
  uint64_t uVar15;
  iterator __first;
  bool bVar16;
  FilterAdapter adapter;
  long local_b0;
  pthread_mutex_t *local_a8;
  int local_98;
  FilterAdapter local_90;
  _func_int **local_60;
  void *local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_50;
  _anonymous_namespace_ *local_48;
  undefined8 *local_40;
  void *local_38;
  
  local_60 = (_func_int **)&PTR__TestStream_001edc90;
  local_90.stream.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001edc90;
  local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.stream.readPos = 0;
  local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.filter = (EventFilter *)session;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    uVar9 = std::__throw_system_error(iVar6);
    pthread_mutex_unlock(local_a8);
    local_90.stream.super_EntryStream._vptr_EntryStream = local_60;
    if (local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(uVar9);
  }
  if (this[0x8a] == (_anonymous_namespace_)0x1) {
    anon_unknown.dwarf_38e175::FilterAdapter::write
              (&local_90,(int)*(long *)(this + 0x40) + 0x18,
               (void *)((*(long *)(this + 0x48) - *(long *)(this + 0x40)) + -0x18),(size_t)filter);
    local_b0 = (*(long *)(this + 0x48) - *(long *)(this + 0x40)) + -0x18;
    this[0x8a] = (_anonymous_namespace_)0x0;
  }
  else {
    local_b0 = 0;
  }
  __n = *(size_t *)(this + 0x70);
  pvVar11 = (void *)(((*(long *)(this + 0x60) - __n) - *(long *)(this + 0x58)) + -0x18);
  local_50 = __return_storage_ptr__;
  anon_unknown.dwarf_38e175::FilterAdapter::write
            (&local_90,(int)__n + (int)*(long *)(this + 0x58) + 0x18,pvVar11,__n);
  *(long *)(this + 0x70) = *(long *)(this + 0x70) + (long)pvVar11;
  local_b0 = local_b0 + (long)pvVar11;
  puVar13 = *(undefined8 **)(this + 0x28);
  local_40 = *(undefined8 **)(this + 0x30);
  if (puVar13 != local_40) {
    local_48 = this + 0x90;
    do {
      if (puVar13[1] == 0) {
        bVar16 = false;
      }
      else {
        bVar16 = *(int *)(puVar13[1] + 8) == 1;
      }
      entry = (WriterProp *)*puVar13;
      uVar1 = entry[1].id;
      local_38 = *(void **)(uVar1 + 0x10);
      pvVar11 = *(void **)(uVar1 + 0x30);
      if (local_38 < pvVar11) {
        local_98 = (int)*(undefined8 *)(uVar1 + 0x28);
        pvVar12 = (void *)((long)*(void **)(uVar1 + 0x18) - (long)pvVar11);
        __buf = local_38;
        iVar6 = local_98;
        if (*(void **)(uVar1 + 0x18) < pvVar11 || pvVar12 == (void *)0x0) goto LAB_001a96d7;
        iVar6 = (int)pvVar11 + local_98;
        __buf = pvVar12;
        local_58 = local_38;
      }
      else {
        __buf = (void *)((long)local_38 - (long)pvVar11);
        iVar6 = (int)pvVar11 + (int)*(undefined8 *)(uVar1 + 0x28);
LAB_001a96d7:
        local_58 = (void *)0x0;
        local_98 = 0;
      }
      uVar15 = (long)local_58 + (long)__buf;
      if (uVar15 != 0) {
        entry->batchSize = uVar15;
        if (*(long *)(this + 0x98) != *(long *)(this + 0x90)) {
          *(long *)(this + 0x98) = *(long *)(this + 0x90);
        }
        __n_00 = this;
        sVar7 = binlog::
                serializeSizePrefixedTagged<binlog::WriterProp,binlog::detail::VectorOutputStream>
                          (entry,(VectorOutputStream *)local_48);
        anon_unknown.dwarf_38e175::FilterAdapter::write
                  (&local_90,(int)*(long *)(this + 0x90),
                   (void *)(*(long *)(this + 0x98) - *(long *)(this + 0x90)),(size_t)__n_00);
        anon_unknown.dwarf_38e175::FilterAdapter::write(&local_90,iVar6,__buf,(size_t)__n_00);
        if (local_58 != (void *)0x0) {
          anon_unknown.dwarf_38e175::FilterAdapter::write
                    (&local_90,local_98,local_58,(size_t)__n_00);
        }
        *(void **)(uVar1 + 0x30) = local_38;
        local_b0 = uVar15 + local_b0 + sVar7;
      }
      if (bVar16) {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar13[1];
        *puVar13 = 0;
        puVar13[1] = 0;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      puVar13 = puVar13 + 2;
    } while (puVar13 != local_40);
  }
  psVar14 = *(shared_ptr<binlog::Session::Channel> **)(this + 0x28);
  psVar3 = *(shared_ptr<binlog::Session::Channel> **)(this + 0x30);
  lVar10 = (long)psVar3 - (long)psVar14 >> 6;
  psVar8 = psVar14;
  if (0 < lVar10) {
    psVar8 = (shared_ptr<binlog::Session::Channel> *)
             ((long)&(psVar14->
                     super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + ((long)psVar3 - (long)psVar14 & 0xffffffffffffffc0U));
    lVar10 = lVar10 + 1;
    __first._M_current = psVar14 + 2;
    do {
      if (__first._M_current[-2].
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __first._M_current = __first._M_current + -2;
        goto LAB_001a9859;
      }
      if (__first._M_current[-1].
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __first._M_current = __first._M_current + -1;
        goto LAB_001a9859;
      }
      if (((__first._M_current)->
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) goto LAB_001a9859;
      if (__first._M_current[1].
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __first._M_current = __first._M_current + 1;
        goto LAB_001a9859;
      }
      lVar10 = lVar10 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar10);
  }
  lVar10 = (long)psVar3 - (long)psVar8 >> 4;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      __first._M_current = psVar3;
      if ((lVar10 != 3) ||
         (__first._M_current = psVar8,
         (psVar8->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
         == (element_type *)0x0)) goto LAB_001a9859;
      psVar8 = psVar8 + 1;
    }
    __first._M_current = psVar8;
    if ((psVar8->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
        (element_type *)0x0) goto LAB_001a9859;
    psVar8 = psVar8 + 1;
  }
  __first._M_current = psVar8;
  if ((psVar8->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    __first._M_current = psVar3;
  }
LAB_001a9859:
  psVar14 = __first._M_current + 1;
  if (psVar14 != psVar3 && __first._M_current != psVar3) {
    do {
      peVar4 = (psVar14->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar4 != (element_type *)0x0) {
        p_Var2 = (psVar14->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_refcount._M_pi;
        (psVar14->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar14->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((__first._M_current)->
        super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar4;
        this_00 = ((__first._M_current)->
                  super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        ((__first._M_current)->
        super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
             = p_Var2;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        __first._M_current = __first._M_current + 1;
      }
      psVar14 = psVar14 + 1;
    } while (psVar14 != psVar3);
  }
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::_M_erase((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              *)(this + 0x28),__first,*(shared_ptr<binlog::Session::Channel> **)(this + 0x30));
  *(long *)(this + 0x80) = *(long *)(this + 0x80) + local_b0;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  pvVar5 = local_50;
  streamToEvents_abi_cxx11_(local_50,&local_90.stream,"%S %m");
  local_90.stream.super_EntryStream._vptr_EntryStream = local_60;
  if (local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pvVar5;
}

Assistant:

std::vector<std::string> filterEvents(binlog::Session& session, binlog::EventFilter& filter)
{
  FilterAdapter adapter{filter, {}};
  session.consume(adapter);
  return streamToEvents(adapter.stream, "%S %m");
}